

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O1

bool slang::ast::Bitstream::canBeTarget
               (StreamingConcatenationExpression *lhs,Expression *rhs,SourceLocation assignLoc,
               ASTContext *context)

{
  Type *pTVar1;
  bool bVar2;
  Diagnostic *pDVar3;
  pointer pcVar4;
  pointer pcVar5;
  Diagnostic *this;
  SourceLocation SVar6;
  SourceLocation SVar7;
  SourceRange range;
  SourceRange *with;
  SourceRange *dynamic;
  SourceRange *local_80;
  SourceRange *local_78;
  string local_70;
  string local_50;
  
  if (rhs->kind != Streaming) {
    pTVar1 = (rhs->type).ptr;
    if (pTVar1 == (Type *)0x0) goto LAB_00213cea;
    bVar2 = Type::isBitstreamType(pTVar1,false);
    if (!bVar2) {
      pDVar3 = ASTContext::addDiag(context,(DiagCode)0x2d0007,assignLoc);
      pTVar1 = (rhs->type).ptr;
      if (pTVar1 == (Type *)0x0) goto LAB_00213cea;
      pDVar3 = ast::operator<<(pDVar3,pTVar1);
      SVar7 = (lhs->super_Expression).sourceRange.startLoc;
      SVar6 = (lhs->super_Expression).sourceRange.endLoc;
      goto LAB_00213b92;
    }
  }
  local_78 = (SourceRange *)0x0;
  local_80 = (SourceRange *)0x0;
  bVar2 = withAfterDynamic(lhs,&local_78,&local_80);
  if (bVar2) {
    pDVar3 = ASTContext::addDiag(context,(DiagCode)0x2f0007,*local_80);
    SVar7 = local_78->startLoc;
    SVar6 = local_78->endLoc;
LAB_00213b92:
    range.endLoc = SVar6;
    range.startLoc = SVar7;
    Diagnostic::operator<<(pDVar3,range);
    return false;
  }
  if (((context->flags).m_bits & 2) != 0) {
    return true;
  }
  pcVar4 = (pointer)StreamingConcatenationExpression::bitstreamWidth(lhs);
  if (rhs->kind == Streaming) {
    pcVar5 = (pointer)StreamingConcatenationExpression::bitstreamWidth
                                ((StreamingConcatenationExpression *)rhs);
    bVar2 = StreamingConcatenationExpression::isFixedSize(lhs);
    if ((bVar2) &&
       (bVar2 = StreamingConcatenationExpression::isFixedSize
                          ((StreamingConcatenationExpression *)rhs), bVar2)) {
      bVar2 = pcVar4 == pcVar5;
    }
    else {
      bVar2 = dynamicSizesMatch<slang::ast::StreamingConcatenationExpression,slang::ast::StreamingConcatenationExpression>
                        (lhs,(StreamingConcatenationExpression *)rhs);
    }
LAB_00213bef:
    if (bVar2 != false) {
      return bVar2;
    }
    pDVar3 = ASTContext::addDiag(context,(DiagCode)0x2b0007,assignLoc);
    if (rhs->kind == Streaming) {
      formatWidth<slang::ast::StreamingConcatenationExpression>(&local_70,lhs,DestFill);
      this = Diagnostic::operator<<(pDVar3,&local_70);
      if (rhs->kind != Streaming) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Expression.h"
                   ,299,
                   "const T &slang::ast::Expression::as() const [T = slang::ast::StreamingConcatenationExpression]"
                  );
      }
      formatWidth<slang::ast::StreamingConcatenationExpression>
                (&local_50,(StreamingConcatenationExpression *)rhs,Source);
      Diagnostic::operator<<(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_70._M_dataplus._M_p = pcVar4;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
      ::emplace_back<unsigned_long>(&pDVar3->args,(unsigned_long *)&local_70);
      local_70._M_dataplus._M_p = pcVar5;
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
      ::emplace_back<unsigned_long>(&pDVar3->args,(unsigned_long *)&local_70);
    }
    Diagnostic::operator<<(pDVar3,(lhs->super_Expression).sourceRange);
    if (rhs->kind != Streaming) {
      return false;
    }
    Diagnostic::operator<<(pDVar3,rhs->sourceRange);
    return false;
  }
  pTVar1 = (rhs->type).ptr;
  if (pTVar1 != (Type *)0x0) {
    bVar2 = Type::isFixedSize(pTVar1);
    if (!bVar2) {
      return true;
    }
    pTVar1 = (rhs->type).ptr;
    if (pTVar1 != (Type *)0x0) {
      pcVar5 = (pointer)Type::bitstreamWidth(pTVar1);
      bVar2 = pcVar4 <= pcVar5;
      goto LAB_00213bef;
    }
  }
LAB_00213cea:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
            );
}

Assistant:

bool Bitstream::canBeTarget(const StreamingConcatenationExpression& lhs, const Expression& rhs,
                            SourceLocation assignLoc, const ASTContext& context) {
    if (rhs.kind != ExpressionKind::Streaming && !rhs.type->isBitstreamType()) {
        context.addDiag(diag::BadStreamSourceType, assignLoc) << *rhs.type << lhs.sourceRange;
        return false;
    }

    const SourceRange *dynamic = nullptr, *with = nullptr;
    if (withAfterDynamic(lhs, dynamic, with)) {
        context.addDiag(diag::BadStreamWithOrder, *with) << *dynamic;
        return false;
    }

    if (context.inUnevaluatedBranch())
        return true; // No size check in an unevaluated conditional branch

    size_t targetWidth = lhs.bitstreamWidth();
    size_t sourceWidth;
    bool good = true;

    if (rhs.kind != ExpressionKind::Streaming) {
        if (!rhs.type->isFixedSize())
            return true; // Sizes checked at constant evaluation or runtime

        sourceWidth = rhs.type->bitstreamWidth();
        good = targetWidth <= sourceWidth;
    }
    else {
        auto& source = rhs.as<StreamingConcatenationExpression>();
        sourceWidth = source.bitstreamWidth();
        if (lhs.isFixedSize() && source.isFixedSize())
            good = targetWidth == sourceWidth;
        else
            good = dynamicSizesMatch(lhs, source);
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadStreamSize, assignLoc);
        if (rhs.kind != ExpressionKind::Streaming)
            diag << targetWidth << sourceWidth;
        else {
            diag << formatWidth(lhs, BitstreamSizeMode::DestFill)
                 << formatWidth(rhs.as<StreamingConcatenationExpression>(),
                                BitstreamSizeMode::Source);
        }

        diag << lhs.sourceRange;
        if (rhs.kind == ExpressionKind::Streaming)
            diag << rhs.sourceRange;
    }

    return good;
}